

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O1

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  Allocator *pAVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  
  iVar1 = bottom_blob->dims;
  if (iVar1 == 3) {
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar12 = bottom_blob->c;
    Mat::create(top_blob,iVar1,iVar2,uVar12,1,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar15) {
      return -100;
    }
    if (0 < (int)uVar12) {
      uVar11 = iVar2 * iVar1;
      uVar13 = 0;
      do {
        if (0 < (int)uVar11) {
          sVar5 = bottom_blob->elemsize;
          sVar6 = top_blob->elemsize;
          sVar7 = top_blob->cstep;
          pvVar10 = top_blob->data;
          sVar8 = bottom_blob->cstep;
          pvVar9 = bottom_blob->data;
          uVar14 = 0;
          do {
            fVar16 = roundf(this->scale *
                            *(float *)((long)pvVar9 + uVar14 * 4 + sVar5 * sVar8 * uVar13));
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            *(char *)((long)pvVar10 + uVar14 + sVar6 * sVar7 * uVar13) = (char)(int)fVar16;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
    }
    if (bVar15) {
      return -100;
    }
  }
  else if (iVar1 == 2) {
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    Mat::create(top_blob,iVar1,iVar2,1,opt->blob_allocator);
    pvVar10 = top_blob->data;
    if (pvVar10 == (void *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar15) {
      return -100;
    }
    uVar12 = iVar2 * iVar1;
    if (0 < (int)uVar12) {
      pvVar9 = bottom_blob->data;
      uVar13 = 0;
      do {
        fVar16 = roundf(this->scale * *(float *)((long)pvVar9 + uVar13 * 4));
        if (fVar16 <= -128.0) {
          fVar16 = -128.0;
        }
        if (127.0 <= fVar16) {
          fVar16 = 127.0;
        }
        *(char *)((long)pvVar10 + uVar13) = (char)(int)fVar16;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (bVar15) {
      return -100;
    }
  }
  else if (iVar1 == 1) {
    uVar12 = bottom_blob->w;
    pAVar3 = opt->blob_allocator;
    if ((((top_blob->dims != 1) || (top_blob->w != uVar12)) || (top_blob->elemsize != 1)) ||
       (top_blob->allocator != pAVar3)) {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 0;
      top_blob->cstep = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->elemsize = 1;
      top_blob->allocator = pAVar3;
      top_blob->dims = 1;
      top_blob->w = uVar12;
      top_blob->h = 1;
      top_blob->c = 1;
      top_blob->cstep = (long)(int)uVar12;
      if (uVar12 != 0) {
        uVar13 = (long)(int)uVar12 + 3U & 0xfffffffffffffffc;
        if (pAVar3 == (Allocator *)0x0) {
          pvVar10 = malloc(uVar13 + 0x1c);
          pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar9 - 8) = pvVar10;
        }
        else {
          pvVar9 = (void *)(*(code *)**(undefined8 **)pAVar3)(pAVar3,uVar13 + 4);
        }
        top_blob->data = pvVar9;
        top_blob->refcount = (int *)((long)pvVar9 + uVar13);
        *(undefined4 *)((long)pvVar9 + uVar13) = 1;
      }
    }
    pvVar10 = top_blob->data;
    if (pvVar10 == (void *)0x0) {
      bVar15 = true;
    }
    else {
      bVar15 = (long)top_blob->c * top_blob->cstep == 0;
    }
    if (bVar15) {
      return -100;
    }
    if (0 < (int)uVar12) {
      pvVar9 = bottom_blob->data;
      uVar13 = 0;
      do {
        fVar16 = roundf(this->scale * *(float *)((long)pvVar9 + uVar13 * 4));
        if (fVar16 <= -128.0) {
          fVar16 = -128.0;
        }
        if (127.0 <= fVar16) {
          fVar16 = 127.0;
        }
        *(char *)((long)pvVar10 + uVar13) = (char)(int)fVar16;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    if (bVar15) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}